

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

int __thiscall
miniros::TransportTCP::connect(TransportTCP *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sockaddr *psVar1;
  Level LVar2;
  int iVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  undefined7 extraout_var;
  char *pcVar8;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  undefined8 uVar9;
  ostream *poVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  bool enabled_6;
  bool enabled_5;
  stringstream ss;
  bool enabled_4;
  int ret;
  bool enabled_3;
  bool enabled_2;
  sockaddr_in6 *address_3;
  sockaddr_in *address_2;
  char namebuf [128];
  addrinfo *it;
  bool found;
  bool enabled_1;
  addrinfo hints;
  addrinfo *addr;
  sockaddr_in6 *address_1;
  sockaddr_in *address;
  in6_addr in6a;
  in_addr ina;
  socklen_t sas_len;
  sockaddr_storage sas;
  bool enabled;
  undefined8 in_stack_fffffffffffffa58;
  LogLocation *in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  undefined4 uVar12;
  socket_fd_t in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  Level in_stack_fffffffffffffa84;
  string *in_stack_fffffffffffffa88;
  void *pvVar13;
  undefined4 in_stack_fffffffffffffa90;
  Level LVar14;
  undefined4 in_stack_fffffffffffffa94;
  char *in_stack_fffffffffffffa98;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  TransportTCP *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  allocator<char> local_481;
  string local_480 [38];
  undefined1 local_45a;
  allocator<char> local_459;
  string local_458 [36];
  undefined4 local_434;
  string local_430 [32];
  stringstream local_410 [16];
  ostream local_400 [8];
  TransportTCP *in_stack_fffffffffffffd28;
  allocator<char> local_281;
  string local_280 [32];
  int local_260;
  undefined1 local_25a;
  allocator<char> local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator<char> local_231;
  string local_230 [32];
  sockaddr *local_210;
  in_addr_t local_204;
  sockaddr *local_200;
  char local_1f8 [128];
  addrinfo *local_178;
  byte local_16b;
  undefined1 local_16a;
  allocator<char> local_169;
  string local_168 [32];
  addrinfo local_148;
  addrinfo *local_118;
  sockaddr *local_110;
  sockaddr *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  socklen_t local_ec;
  sockaddr local_e8 [8];
  undefined1 local_65;
  allocator<char> local_51;
  string local_50 [36];
  int local_2c;
  string *local_28;
  TransportTCP *local_20;
  undefined1 local_11;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  LVar14 = (Level)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  local_28 = (string *)CONCAT44(in_register_00000034,__fd);
  local_2c = (int)__addr;
  local_20 = this;
  bVar4 = Transport::isHostAllowed
                    ((Transport *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                     in_stack_fffffffffffffb40);
  uVar11 = CONCAT71(extraout_var,bVar4);
  if (bVar4) {
    iVar6 = 2;
    if ((s_use_ipv6_ & 1) != 0) {
      iVar6 = 10;
    }
    iVar6 = socket(iVar6,1,0);
    this->sock_ = iVar6;
    std::__cxx11::string::operator=((string *)&this->connected_host_,local_28);
    this->connected_port_ = local_2c;
    if (this->sock_ == -1) {
      if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((connect::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90))
        ;
        console::initializeLogLocation
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator(&local_51);
      }
      if (connect::loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      }
      pvVar13 = connect::loc.logger_;
      LVar14 = connect::loc.level_;
      local_65 = (connect::loc.logger_enabled_ & 1U) != 0;
      uVar11 = 0;
      if ((bool)local_65) {
        pcVar8 = last_socket_error_string();
        console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xf2,"bool miniros::TransportTCP::connect(const std::string &, int)",
                       "socket() failed with error [%s]",pcVar8);
        uVar11 = extraout_RAX;
      }
      local_11 = 0;
    }
    else {
      setNonBlocking(in_stack_fffffffffffffac8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      iVar6 = inet_pton(2,pcVar8,&local_f0);
      if (iVar6 == 1) {
        local_108 = local_e8;
        local_ec = 0x10;
        this->la_len_ = 0x10;
        local_e8[0].sa_family = 2;
        uVar5 = htons((uint16_t)local_2c);
        *(uint16_t *)local_108->sa_data = uVar5;
        *(undefined4 *)(local_108->sa_data + 2) = local_f0;
      }
      else {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar6 = inet_pton(10,pcVar8,&local_100);
        if (iVar6 == 1) {
          local_110 = local_e8;
          local_ec = 0x1c;
          this->la_len_ = 0x1c;
          local_e8[0].sa_family = 10;
          uVar5 = htons((uint16_t)local_2c);
          *(uint16_t *)local_110->sa_data = uVar5;
          psVar1 = local_110;
          *(undefined8 *)(local_110->sa_data + 6) = local_100;
          psVar1[1].sa_family = (undefined2)local_f8;
          psVar1[1].sa_data[0] = local_f8._2_1_;
          psVar1[1].sa_data[1] = local_f8._3_1_;
          psVar1[1].sa_data[2] = local_f8._4_1_;
          psVar1[1].sa_data[3] = local_f8._5_1_;
          psVar1[1].sa_data[4] = local_f8._6_1_;
          psVar1[1].sa_data[5] = local_f8._7_1_;
        }
        else {
          memset(&local_148,0,0x30);
          local_148.ai_family = 0;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          iVar6 = getaddrinfo(pcVar8,(char *)0x0,&local_148,&local_118);
          if (iVar6 != 0) {
            (*(this->super_Transport)._vptr_Transport[8])();
            if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((connect(std::__cxx11::string_const&,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
              std::__cxx11::string::~string(local_168);
              std::allocator<char>::~allocator(&local_169);
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Error) {
              console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
            }
            local_16a = (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ & 1U) != 0;
            uVar11 = 0;
            if ((bool)local_16a) {
              pvVar13 = connect(std::__cxx11::string_const&,int)::loc.logger_;
              LVar14 = connect(std::__cxx11::string_const&,int)::loc.level_;
              uVar9 = std::__cxx11::string::c_str();
              console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                             ,0x11a,"bool miniros::TransportTCP::connect(const std::string &, int)",
                             "couldn\'t resolve publisher host [%s]",uVar9);
              uVar11 = extraout_RAX_00;
            }
            local_11 = 0;
            goto LAB_0050d0f1;
          }
          local_16b = 0;
          local_178 = local_118;
          memset(local_1f8,0,0x80);
          for (; local_178 != (addrinfo *)0x0; local_178 = local_178->ai_next) {
            if (((s_use_ipv6_ & 1) == 0) && (local_178->ai_family == 2)) {
              local_200 = local_e8;
              local_ec = 0x10;
              memcpy(local_200,local_178->ai_addr,(ulong)local_178->ai_addrlen);
              local_200->sa_family = (sa_family_t)local_178->ai_family;
              uVar5 = htons((uint16_t)local_2c);
              *(uint16_t *)local_200->sa_data = uVar5;
              local_204 = *(in_addr_t *)(local_200->sa_data + 2);
              pcVar8 = inet_ntoa((in_addr)local_204);
              strncpy(local_1f8,pcVar8,0x7f);
              local_16b = 1;
              break;
            }
            if (((s_use_ipv6_ & 1) != 0) && (local_178->ai_family == 10)) {
              local_210 = local_e8;
              local_ec = 0x1c;
              memcpy(local_210,local_178->ai_addr,(ulong)local_178->ai_addrlen);
              local_210->sa_family = (sa_family_t)local_178->ai_family;
              uVar5 = htons((uint16_t)local_2c);
              *(uint16_t *)local_210->sa_data = uVar5;
              inet_ntop(10,local_210->sa_data + 6,local_1f8,0x80);
              local_16b = 1;
              break;
            }
          }
          freeaddrinfo(local_118);
          if ((local_16b & 1) == 0) {
            if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((connect(std::__cxx11::string_const&,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
              std::__cxx11::string::~string(local_230);
              std::allocator<char>::~allocator(&local_231);
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Error) {
              console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
            }
            pvVar13 = connect(std::__cxx11::string_const&,int)::loc.logger_;
            LVar14 = connect(std::__cxx11::string_const&,int)::loc.level_;
            local_232 = (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ & 1U) != 0;
            uVar11 = 0;
            if ((bool)local_232) {
              uVar9 = std::__cxx11::string::c_str();
              console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                             ,0x144,"bool miniros::TransportTCP::connect(const std::string &, int)",
                             "Couldn\'t resolve an address for [%s]\n",uVar9);
              uVar11 = extraout_RAX_01;
            }
            local_11 = 0;
            goto LAB_0050d0f1;
          }
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((connect(std::__cxx11::string_const&,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
            console::initializeLogLocation
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
            std::__cxx11::string::~string(local_258);
            std::allocator<char>::~allocator(&local_259);
          }
          if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
            console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
            console::checkLogLocationEnabled
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70))
            ;
          }
          pvVar13 = connect(std::__cxx11::string_const&,int)::loc.logger_;
          LVar2 = connect(std::__cxx11::string_const&,int)::loc.level_;
          local_25a = (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ & 1U) != 0;
          if ((bool)local_25a) {
            in_stack_fffffffffffffa60 = (LogLocation *)std::__cxx11::string::c_str();
            pcVar8 = local_1f8;
            in_stack_fffffffffffffa70 = this->sock_;
            LVar14 = Debug;
            console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                           ,0x148,"bool miniros::TransportTCP::connect(const std::string &, int)",
                           "Resolved publisher host [%s] to [%s] for socket [%d]",
                           in_stack_fffffffffffffa60,pcVar8);
            uVar12 = (undefined4)((ulong)pcVar8 >> 0x20);
          }
        }
      }
      local_260 = ::connect(this->sock_,local_e8,local_ec);
      if ((((this->flags_ & 1U) == 0) || (local_260 == 0)) &&
         (((this->flags_ & 1U) != 0 ||
          ((local_260 == 0 || (iVar6 = last_socket_error(), iVar6 == 0x73)))))) {
        std::__cxx11::stringstream::stringstream(local_410);
        poVar10 = std::operator<<(local_400,local_28);
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2c);
        poVar10 = std::operator<<(poVar10," on socket ");
        std::ostream::operator<<(poVar10,this->sock_);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=((string *)&this->cached_remote_host_,local_430);
        std::__cxx11::string::~string(local_430);
        bVar4 = initializeSocket(in_stack_fffffffffffffd28);
        if (bVar4) {
          if ((this->flags_ & 1U) == 0) {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((connect(std::__cxx11::string_const&,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
              __s = &local_481;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffaa0,(char *)__s,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
              std::__cxx11::string::~string(local_480);
              std::allocator<char>::~allocator(&local_481);
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
              console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
            }
            if ((connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ & 1U) != 0) {
              pvVar13 = connect(std::__cxx11::string_const&,int)::loc.logger_;
              LVar14 = connect(std::__cxx11::string_const&,int)::loc.level_;
              uVar9 = std::__cxx11::string::c_str();
              console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                             ,0x16f,"bool miniros::TransportTCP::connect(const std::string &, int)",
                             "Async connect() in progress to [%s:%d] on socket [%d]",uVar9,
                             CONCAT44(uVar12,local_2c),this->sock_);
            }
          }
          else {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((connect(std::__cxx11::string_const&,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
              std::__cxx11::string::~string(local_458);
              std::allocator<char>::~allocator(&local_459);
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
              console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
            }
            LVar14 = connect(std::__cxx11::string_const&,int)::loc.level_;
            local_45a = (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ & 1U) != 0;
            if ((bool)local_45a) {
              pvVar13 = connect(std::__cxx11::string_const&,int)::loc.logger_;
              uVar9 = std::__cxx11::string::c_str();
              console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                             ,0x16b,"bool miniros::TransportTCP::connect(const std::string &, int)",
                             "connect() succeeded to [%s:%d] on socket [%d]",uVar9,
                             CONCAT44(uVar12,local_2c),this->sock_);
            }
          }
          local_11 = 1;
        }
        else {
          local_11 = 0;
        }
        local_434 = 1;
        uVar11 = std::__cxx11::stringstream::~stringstream(local_410);
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((connect(std::__cxx11::string_const&,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator(&local_281);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
          console::setLogLocationLevel(in_stack_fffffffffffffa60,LVar14);
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        }
        pvVar13 = connect(std::__cxx11::string_const&,int)::loc.logger_;
        LVar14 = connect(std::__cxx11::string_const&,int)::loc.level_;
        if ((connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ & 1U) != 0) {
          uVar9 = std::__cxx11::string::c_str();
          iVar3 = local_2c;
          iVar6 = local_260;
          pcVar8 = last_socket_error_string();
          console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                         ,0x152,"bool miniros::TransportTCP::connect(const std::string &, int)",
                         "Connect to tcpros publisher [%s:%d] failed with error [%d, %s]",uVar9,
                         CONCAT44(uVar12,iVar3),iVar6,pcVar8);
        }
        uVar7 = (*(this->super_Transport)._vptr_Transport[8])();
        uVar11 = (ulong)uVar7;
        local_11 = 0;
      }
    }
  }
  else {
    local_11 = 0;
  }
LAB_0050d0f1:
  return (uint)CONCAT71((int7)(uVar11 >> 8),local_11) & 0xffffff01;
}

Assistant:

bool TransportTCP::connect(const std::string& host, int port)
{
  if (!isHostAllowed(host))
    return false; // adios amigo

  sock_ = socket(s_use_ipv6_ ? AF_INET6 : AF_INET, SOCK_STREAM, 0);
  connected_host_ = host;
  connected_port_ = port;

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  setNonBlocking();

  sockaddr_storage sas;
  socklen_t sas_len;

  in_addr ina;
  in6_addr in6a;
  if (inet_pton(AF_INET, host.c_str(), &ina) == 1)
  {
    sockaddr_in *address = (sockaddr_in*) &sas;
    sas_len = sizeof(sockaddr_in);
    
    la_len_ = sizeof(sockaddr_in);
    address->sin_family = AF_INET;
    address->sin_port = htons(port);
    address->sin_addr.s_addr = ina.s_addr;
  }
  else if (inet_pton(AF_INET6, host.c_str(), &in6a) == 1)
  {
    sockaddr_in6 *address = (sockaddr_in6*) &sas;
    sas_len = sizeof(sockaddr_in6);
    la_len_ = sizeof(sockaddr_in6);
    address->sin6_family = AF_INET6;
    address->sin6_port = htons(port);
    memcpy(address->sin6_addr.s6_addr, in6a.s6_addr, sizeof(in6a.s6_addr));
  }
  else
  {
    struct addrinfo* addr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;

    if (getaddrinfo(host.c_str(), NULL, &hints, &addr) != 0)
    {
      close();
      MINIROS_ERROR("couldn't resolve publisher host [%s]", host.c_str());
      return false;
    }

    bool found = false;
    struct addrinfo* it = addr;
    char namebuf[128] = {};
    for (; it; it = it->ai_next)
    {
      if (!s_use_ipv6_ && it->ai_family == AF_INET)
      {
        sockaddr_in *address = (sockaddr_in*) &sas;
        sas_len = sizeof(*address);
        
        memcpy(address, it->ai_addr, it->ai_addrlen);
        address->sin_family = it->ai_family;
        address->sin_port = htons(port);
	
        strncpy(namebuf, inet_ntoa(address->sin_addr), sizeof(namebuf)-1);
        found = true;
        break;
      }
      if (s_use_ipv6_ && it->ai_family == AF_INET6)
      {
        sockaddr_in6 *address = (sockaddr_in6*) &sas;
        sas_len = sizeof(*address);
      
        memcpy(address, it->ai_addr, it->ai_addrlen);
        address->sin6_family = it->ai_family;
        address->sin6_port = htons((u_short) port);
      
        // TODO IPV6: does inet_ntop need other includes for Windows?
        inet_ntop(AF_INET6, (void*)&(address->sin6_addr), namebuf, sizeof(namebuf));
        found = true;
        break;
      }
    }

    freeaddrinfo(addr);

    if (!found)
    {
      MINIROS_ERROR("Couldn't resolve an address for [%s]\n", host.c_str());
      return false;
    }

    MINIROS_DEBUG("Resolved publisher host [%s] to [%s] for socket [%d]", host.c_str(), namebuf, sock_);
  }

  int ret = ::connect(sock_, (sockaddr*) &sas, sas_len);
  // windows might need some time to sleep (input from service robotics hack) add this if testing proves it is necessary.
  // MINIROS_ASSERT((flags_ & SYNCHRONOUS) || ret != 0);
  if (((flags_ & SYNCHRONOUS) && ret != 0) || // synchronous, connect() should return 0
      (!(flags_ & SYNCHRONOUS) && ret != 0 && last_socket_error() != ROS_SOCKETS_ASYNCHRONOUS_CONNECT_RETURN)) 
      // asynchronous, connect() may return 0 or -1. When return -1, WSAGetLastError()=WSAEWOULDBLOCK/errno=EINPROGRESS
  {
    MINIROS_DEBUG("Connect to tcpros publisher [%s:%d] failed with error [%d, %s]", host.c_str(), port, ret, last_socket_error_string());
    close();

    return false;
  }

  // from daniel stonier:
#ifdef WIN32
  // This is hackish, but windows fails at recv() if its slow to connect (e.g. happens with wireless)
  // recv() needs to check if its connected or not when its asynchronous?
  Sleep(100);
#endif


  std::stringstream ss;
  ss << host << ":" << port << " on socket " << sock_;
  cached_remote_host_ = ss.str();

  if (!initializeSocket())
  {
    return false;
  }

  if (flags_ & SYNCHRONOUS)
  {
    MINIROS_DEBUG("connect() succeeded to [%s:%d] on socket [%d]", host.c_str(), port, sock_);
  }
  else
  {
    MINIROS_DEBUG("Async connect() in progress to [%s:%d] on socket [%d]", host.c_str(), port, sock_);
  }

  return true;
}